

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void * pugi::impl::anon_unknown_0::document_buffer_order(xpath_node *xnode)

{
  xml_document_struct *pxVar1;
  xml_attribute local_38;
  xml_attribute_struct *local_30;
  xml_attribute_struct *attr;
  xml_node_struct *local_20;
  xml_node_struct *node;
  xpath_node *xnode_local;
  
  node = (xml_node_struct *)xnode;
  attr = (xml_attribute_struct *)xpath_node::node(xnode);
  local_20 = xml_node::internal_object((xml_node *)&attr);
  if (local_20 == (xml_node_struct *)0x0) {
    local_38 = xpath_node::attribute((xpath_node *)node);
    local_30 = xml_attribute::internal_object(&local_38);
    if (local_30 == (xml_attribute_struct *)0x0) {
      return (void *)0x0;
    }
    pxVar1 = get_document<pugi::xml_attribute_struct>(local_30);
    if (((pxVar1->super_xml_node_struct).header & 0x40) == 0) {
      if ((local_30->header & 0x60) == 0) {
        return local_30->name;
      }
      if ((local_30->header & 0x50) == 0) {
        return local_30->value;
      }
    }
    return (void *)0x0;
  }
  pxVar1 = get_document<pugi::xml_node_struct>(local_20);
  if (((pxVar1->super_xml_node_struct).header & 0x40) == 0) {
    if ((local_20->name != (char_t *)0x0) && ((local_20->header & 0x60) == 0)) {
      return local_20->name;
    }
    if ((local_20->value != (char_t *)0x0) && ((local_20->header & 0x50) == 0)) {
      return local_20->value;
    }
  }
  return (void *)0x0;
}

Assistant:

PUGI__FN const void* document_buffer_order(const xpath_node& xnode)
	{
		xml_node_struct* node = xnode.node().internal_object();

		if (node)
		{
			if ((get_document(node).header & xml_memory_page_contents_shared_mask) == 0)
			{
				if (node->name && (node->header & impl::xml_memory_page_name_allocated_or_shared_mask) == 0) return node->name;
				if (node->value && (node->header & impl::xml_memory_page_value_allocated_or_shared_mask) == 0) return node->value;
			}

			return 0;
		}

		xml_attribute_struct* attr = xnode.attribute().internal_object();

		if (attr)
		{
			if ((get_document(attr).header & xml_memory_page_contents_shared_mask) == 0)
			{
				if ((attr->header & impl::xml_memory_page_name_allocated_or_shared_mask) == 0) return attr->name;
				if ((attr->header & impl::xml_memory_page_value_allocated_or_shared_mask) == 0) return attr->value;
			}

			return 0;
		}

		return 0;
	}